

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall
QWidgetPrivate::drawWidget
          (QWidgetPrivate *this,QPaintDevice *pdev,QRegion *rgn,QPoint *offset,DrawWidgetFlags flags
          ,QPainter *sharedPainter,QWidgetRepaintManager *repaintManager)

{
  long lVar1;
  QWidget *widget;
  QGraphicsEffectSourcePrivate *this_00;
  QWidgetData *pQVar2;
  qreal qVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char cVar8;
  bool bVar9;
  bool bVar10;
  QFlagsStorage<QWidgetPrivate::DrawWidgetFlag> QVar11;
  int iVar12;
  QWidgetPrivate *d;
  QDebug *pQVar13;
  QPoint *pQVar14;
  long *plVar15;
  QPalette *pQVar16;
  QBrush *pQVar17;
  QPoint QVar18;
  QPaintEngine *pQVar19;
  QTransform *this_01;
  undefined1 *puVar20;
  byte bVar21;
  QFlagsStorage<QWidgetPrivate::DrawWidgetFlag> flags_00;
  long lVar22;
  QRegion *this_02;
  undefined1 *puVar23;
  QWidgetPrivate *pQVar24;
  long in_FS_OFFSET;
  QRect QVar25;
  undefined1 auVar26 [16];
  QPoint local_d0;
  QRegion effectRgn;
  undefined8 local_c0;
  QBrush bg;
  QRegion local_b0;
  QPainter p_1;
  undefined1 local_a0 [8];
  QRegion toBePainted;
  QPoint local_90;
  QDebug local_88;
  undefined1 local_80 [8];
  QWidgetPaintContext context;
  
  bVar21 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar8 = QRegion::isEmpty();
  if (cVar8 != '\0') goto LAB_002f2889;
  widget = *(QWidget **)&this->field_0x8;
  QtPrivateLogging::lcWidgetPainting();
  if (((byte)QtPrivateLogging::lcWidgetPainting::category.field_2.bools.enabledInfo._q_value._M_base
             ._M_i & 1) != 0) {
    context.pdev._0_4_ = 2;
    context.pdev._4_4_ = 0;
    context.rgn.d._0_4_ = 0;
    context.rgn.d._4_4_ = 0;
    context.offset.xp.m_i = 0;
    context.offset.yp.m_i = 0;
    context._24_8_ = QtPrivateLogging::lcWidgetPainting::category.name;
    QMessageLogger::info();
    pQVar13 = QDebug::operator<<((QDebug *)&bg,"Drawing");
    local_b0.d = (QRegionData *)pQVar13->stream;
    *(int *)((Stream *)local_b0.d + 0x28) = *(int *)((Stream *)local_b0.d + 0x28) + 1;
    ::operator<<((Stream *)&p_1,&local_b0);
    pQVar13 = QDebug::operator<<((QDebug *)&p_1,"of");
    local_a0 = (undefined1  [8])pQVar13->stream;
    *(int *)((long)local_a0 + 0x28) = *(int *)((long)local_a0 + 0x28) + 1;
    ::operator<<((Stream *)&toBePainted,(QWidget *)local_a0);
    pQVar14 = (QPoint *)QDebug::operator<<((QDebug *)&toBePainted,"at");
    local_90 = *pQVar14;
    *(int *)((long)local_90 + 0x28) = *(int *)((long)local_90 + 0x28) + 1;
    ::operator<<((Stream *)&effectRgn,&local_90);
    pQVar13 = QDebug::operator<<((QDebug *)&effectRgn,"into paint device");
    pQVar13 = QDebug::operator<<(pQVar13,pdev);
    pQVar13 = QDebug::operator<<(pQVar13,"with");
    local_88.stream = pQVar13->stream;
    *(int *)(local_88.stream + 0x28) = *(int *)(local_88.stream + 0x28) + 1;
    operator<<<QFlags<QWidgetPrivate::DrawWidgetFlag>,_true>
              ((Stream *)local_80,
               (QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>)SUB84(&local_88,0));
    QDebug::~QDebug((QDebug *)local_80);
    QDebug::~QDebug(&local_88);
    QDebug::~QDebug((QDebug *)&effectRgn);
    QDebug::~QDebug((QDebug *)&local_90);
    QDebug::~QDebug((QDebug *)&toBePainted);
    QDebug::~QDebug((QDebug *)local_a0);
    QDebug::~QDebug((QDebug *)&p_1);
    QDebug::~QDebug((QDebug *)&local_b0);
    QDebug::~QDebug((QDebug *)&bg);
  }
  bVar9 = shouldPaintOnScreen(this);
  if (this->graphicsEffect == (QGraphicsEffect *)0x0) {
LAB_002f27b0:
    toBePainted.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion(&toBePainted,rgn);
    if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
               super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 9) == 1) {
      QVar25 = clipRect(this);
      context.pdev._0_4_ = QVar25.x1.m_i;
      context.pdev._4_4_ = QVar25.y1.m_i;
      context.rgn.d._0_4_ = QVar25.x2.m_i;
      context.rgn.d._4_4_ = QVar25.y2.m_i;
      QRegion::operator&=(&toBePainted,(QRect *)&context);
    }
    if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
               super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 0x10) == 0) {
      QVar25 = QWidget::rect(widget);
      context.pdev._0_4_ = QVar25.x1.m_i;
      context.pdev._4_4_ = QVar25.y1.m_i;
      context.rgn.d._0_4_ = QVar25.x2.m_i;
      context.rgn.d._4_4_ = QVar25.y2.m_i;
      subtractOpaqueChildren(this,&toBePainted,(QRect *)&context);
    }
    cVar8 = QRegion::isEmpty();
    if (cVar8 == '\0') {
      if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                 super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 2) == 0 && bVar9) {
        if (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
          plVar15 = (long *)(**(code **)(*(long *)pdev + 0x18))(pdev);
          if (plVar15 != (long *)0x0) {
            _p_1 = &DAT_aaaaaaaaaaaaaaaa;
            QPainter::QPainter(&p_1,pdev);
            QPainter::setClipRegion((QRegion *)&p_1,(ClipOperation)&toBePainted);
            _bg = &DAT_aaaaaaaaaaaaaaaa;
            pQVar16 = QWidget::palette(widget);
            pQVar17 = QPalette::brush(pQVar16,Window);
            QBrush::QBrush(&bg,pQVar17);
            if (*(int *)(_bg + 4) == 0x18) {
              _effectRgn = QWidget::rect(widget);
              QBrush::texture();
              local_d0.xp.m_i = 0;
              local_d0.yp.m_i = 0;
              QPainter::drawTiledPixmap(&p_1,(QRect *)&effectRgn,(QPixmap *)&context,&local_d0);
              QPixmap::~QPixmap((QPixmap *)&context);
            }
            else {
              QVar25 = QWidget::rect(widget);
              context.pdev._0_4_ = QVar25.x1.m_i;
              context.pdev._4_4_ = QVar25.y1.m_i;
              context.rgn.d._0_4_ = QVar25.x2.m_i;
              context.rgn.d._4_4_ = QVar25.y2.m_i;
              QPainter::fillRect((QRect *)&p_1,(QBrush *)&context);
            }
            if ((*(byte *)((long)plVar15 + 0x14) & 2) != 0) {
              (**(code **)(*plVar15 + 8))();
            }
            QBrush::~QBrush(&bg);
            QPainter::~QPainter(&p_1);
          }
        }
      }
      else {
        if ((*(byte *)(*(long *)&widget->field_0x8 + 0x243) & 0x40) != 0) {
          context.pdev._0_4_ = 2;
          context.offset.yp.m_i = 0;
          context.pdev._4_4_ = 0;
          context.rgn.d._0_4_ = 0;
          context.rgn.d._4_4_ = 0;
          context.offset.xp.m_i = 0;
          context._24_8_ = anon_var_dwarf_66827;
          QMessageLogger::warning((char *)&context,"QWidget::repaint: Recursive repaint detected");
        }
        QWidget::setAttribute(widget,WA_WState_InPaintEvent,true);
        plVar15 = (long *)(**(code **)(*(long *)pdev + 0x18))(pdev);
        if (plVar15 != (long *)0x0) {
          QVar18.yp.m_i = -(offset->yp).m_i;
          QVar18.xp.m_i = -(offset->xp).m_i;
          this->redirectDev = pdev;
          this->redirectOffset = QVar18;
          if (sharedPainter == (QPainter *)0x0) {
            pQVar2 = widget->data;
            lVar22 = plVar15[3];
            iVar12 = (pQVar2->crect).y1.m_i;
            iVar4 = (pQVar2->crect).x2.m_i;
            iVar5 = (pQVar2->crect).y2.m_i;
            *(int *)(lVar22 + 0x28) = (pQVar2->crect).x1.m_i;
            *(int *)(lVar22 + 0x2c) = iVar12;
            *(int *)(lVar22 + 0x30) = iVar4;
            *(int *)(lVar22 + 0x34) = iVar5;
          }
          else {
            pQVar19 = (QPaintEngine *)(**(code **)(*(long *)pdev + 0x18))(pdev);
            pQVar24 = (QWidgetPrivate *)pdev;
            qVar3 = (qreal)QPaintDevice::devicePixelRatio();
            setSystemClip(pQVar24,pQVar19,qVar3,&toBePainted);
          }
          if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                     super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 1) == 0) {
            lVar22 = *(long *)(*(long *)&widget->field_0x8 + 0x78);
            if (lVar22 == 0) {
              bVar21 = 0;
            }
            else {
              bVar21 = (*(byte *)(lVar22 + 0x7c) & 0x10) >> 4;
            }
            if ((bVar21 != 0 || bVar9) ||
               ((*(byte *)(*(long *)&widget->field_0x8 + 0x247) & 0x20) != 0)) goto LAB_002f2d91;
          }
          else {
LAB_002f2d91:
            if ((widget->data->widget_attributes & 0x210) == 0) {
              (**(code **)(*(long *)this + 0x60))(this);
              context.pdev._0_4_ = -0x55555556;
              context.pdev._4_4_ = -0x55555556;
              QPainter::QPainter((QPainter *)&context,&widget->super_QPaintDevice);
              QPainter::setRenderHint((RenderHint)&context,true);
              QVar11.i = (uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                               super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 0xfffffefe |
                         1;
              flags_00.i = 0;
              if (bVar9) {
                flags_00.i = QVar11.i;
              }
              if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                         super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 1) != 0) {
                flags_00.i = QVar11.i;
              }
              paintBackground(this,(QPainter *)&context,&toBePainted,(DrawWidgetFlags)flags_00.i);
              (**(code **)(*(long *)this + 0x68))(this);
              QPainter::~QPainter((QPainter *)&context);
            }
          }
          if (sharedPainter == (QPainter *)0x0) {
            pQVar19 = (QPaintEngine *)(**(code **)(*(long *)pdev + 0x18))(pdev);
            qVar3 = (qreal)QPaintDevice::devicePixelRatio();
            pQVar24 = (QWidgetPrivate *)&context;
            QRegion::translated((QRegion *)&context,(QPoint *)&toBePainted);
            setSystemClip(pQVar24,pQVar19,qVar3,(QRegion *)&context);
            QRegion::~QRegion((QRegion *)&context);
          }
          if (((!bVar9 && ((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                                 super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 1) == 0) &&
              ((this->field_0x252 & 2) == 0)) &&
             ((*(byte *)(*(long *)&widget->field_0x8 + 0x246) & 4) != 0)) {
            (**(code **)(*(long *)this + 0x60))(this);
            _p_1 = &DAT_aaaaaaaaaaaaaaaa;
            QPainter::QPainter(&p_1,&widget->super_QPaintDevice);
            pQVar16 = QWidget::palette(widget);
            pQVar17 = QPalette::window(pQVar16);
            uVar6 = *(undefined8 *)(*(long *)pQVar17 + 8);
            uVar7 = *(undefined8 *)(*(long *)pQVar17 + 0x10);
            context.pdev._0_4_ = (int)uVar6;
            context.pdev._4_4_ = (int)((ulong)uVar6 >> 0x20);
            context.rgn.d._0_4_ = (int)uVar7;
            context.rgn.d._4_4_ = (int)((ulong)uVar7 >> 0x20);
            QColor::setAlphaF(0.6);
            _effectRgn = (QRect)QRegion::boundingRect();
            QPainter::fillRect((QRect *)&p_1,(QColor *)&effectRgn);
            (**(code **)(*(long *)this + 0x68))(this);
            QPainter::~QPainter(&p_1);
          }
        }
        if ((this->field_0x253 & 1) == 0) {
LAB_002f2f4f:
          sendPaintEvent(this,&toBePainted);
        }
        else {
          (**(code **)(*(long *)this + 0x60))(this);
          if ((repaintManager == (QWidgetRepaintManager *)0x0) ||
             ((*(uint *)(*(long *)&widget->field_0x8 + 0x24c) & 1) != 0)) {
            if (repaintManager != (QWidgetRepaintManager *)0x0) goto LAB_002f2ff3;
            context.offset.xp.m_i = -0x55555556;
            context.offset.yp.m_i = -0x55555556;
            context.pdev._0_4_ = -0x55555556;
            context.pdev._4_4_ = -0x55555556;
            context.rgn.d._0_4_ = -0x55555556;
            context.rgn.d._4_4_ = -0x55555556;
            (**(code **)(*(long *)this + 0x58))(&context,this);
            iVar12 = QImage::format();
            if (iVar12 == 4) {
              QImage::reinterpretAsFormat((Format)&context);
            }
            _p_1 = &DAT_aaaaaaaaaaaaaaaa;
            QPainter::QPainter(&p_1,&widget->super_QPaintDevice);
            _effectRgn = QWidget::rect(widget);
            QPainter::drawImage(&p_1,(QRect *)&effectRgn,(QImage *)&context);
            QPainter::~QPainter(&p_1);
            QImage::~QImage((QImage *)&context);
            bVar9 = true;
          }
          else {
            effectRgn.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QPainter::QPainter((QPainter *)&effectRgn,&widget->super_QPaintDevice);
            QPainter::setCompositionMode((CompositionMode)(QPainter *)&effectRgn);
            QVar25 = QWidget::rect(widget);
            context.pdev._0_4_ = QVar25.x1.m_i;
            context.pdev._4_4_ = QVar25.y1.m_i;
            context.rgn.d._0_4_ = QVar25.x2.m_i;
            context.rgn.d._4_4_ = QVar25.y2.m_i;
            QPainter::fillRect((QPainter *)&effectRgn,(QRect *)&context,transparent);
            QPainter::~QPainter((QPainter *)&effectRgn);
LAB_002f2ff3:
            bVar9 = false;
          }
          (**(code **)(*(long *)this + 0x68))(this);
          if (((*(uint *)&this->field_0x250 >> 0x1b & 1) != 0) &&
             (*(uint *)&this->field_0x250 = *(uint *)&this->field_0x250 & 0xf7ffffff, !bVar9))
          goto LAB_002f2f4f;
        }
        if (repaintManager != (QWidgetRepaintManager *)0x0) {
          QWidgetRepaintManager::markNeedsFlush
                    ((QWidgetRepaintManager *)repaintManager,widget,&toBePainted,offset);
        }
        if (plVar15 != (long *)0x0) {
          this->redirectDev = (QPaintDevice *)0x0;
          lVar22 = plVar15[3];
          if (sharedPainter == (QPainter *)0x0) {
            *(undefined4 *)(lVar22 + 0x28) = 0;
            *(undefined4 *)(lVar22 + 0x2c) = 0;
            *(undefined4 *)(lVar22 + 0x30) = 0xffffffff;
            *(undefined4 *)(lVar22 + 0x34) = 0xffffffff;
          }
          else {
            *(undefined8 *)(lVar22 + 0x90) = 0;
          }
          pQVar19 = (QPaintEngine *)(**(code **)(*(long *)pdev + 0x18))(pdev);
          pQVar24 = (QWidgetPrivate *)&context;
          QRegion::QRegion((QRegion *)&context);
          setSystemClip(pQVar24,pQVar19,1.0,(QRegion *)&context);
          QRegion::~QRegion((QRegion *)&context);
        }
        QWidget::setAttribute(widget,WA_WState_InPaintEvent,false);
        if (*(short *)&widget->field_0x18 != 0) {
          context.pdev._0_4_ = 2;
          context.offset.yp.m_i = 0;
          context.pdev._4_4_ = 0;
          context.rgn.d._0_4_ = 0;
          context.rgn.d._4_4_ = 0;
          context.offset.xp.m_i = 0;
          context._24_8_ = anon_var_dwarf_66827;
          QMessageLogger::warning
                    ((char *)&context,
                     "QWidget::repaint: It is dangerous to leave painters active on a widget outside of the PaintEvent"
                    );
        }
        if ((plVar15 != (long *)0x0) && ((*(byte *)((long)plVar15 + 0x14) & 2) != 0)) {
          (**(code **)(*plVar15 + 8))(plVar15);
        }
      }
    }
    if ((((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 4) != 0) &&
       (*(long *)&this->field_0x28 != 0)) {
      paintSiblingsRecursive
                (this,pdev,(QObjectList *)&this->field_0x18,(int)*(long *)&this->field_0x28 + -1,rgn
                 ,offset,(DrawWidgetFlags)
                         ((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
                                super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i & 0xfffffefe),
                 sharedPainter,repaintManager);
    }
    this_02 = &toBePainted;
  }
  else {
    bVar10 = QGraphicsEffect::isEnabled(this->graphicsEffect);
    if ((!bVar10) ||
       (this_00 = *(QGraphicsEffectSourcePrivate **)
                   (*(long *)(*(long *)&this->graphicsEffect->field_0x8 + 0x78) + 8),
       *(long *)&this_00[1].field_0x8 != 0)) goto LAB_002f27b0;
    effectRgn.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    if (((uint)flags.super_QFlagsStorageHelper<QWidgetPrivate::DrawWidgetFlag,_4>.
               super_QFlagsStorage<QWidgetPrivate::DrawWidgetFlag>.i >> 8 & 1) == 0) {
      QRegion::QRegion(&effectRgn,rgn);
    }
    else {
      auVar26 = QRegion::boundingRect();
      context.pdev._0_4_ = auVar26._0_4_;
      context.pdev._4_4_ = auVar26._4_4_;
      context.rgn.d._0_4_ = auVar26._8_4_;
      context.rgn.d._4_4_ = auVar26._12_4_;
      QRegion::QRegion(&effectRgn,(QRect *)&context,Rectangle);
    }
    context.painter = (QPainter *)&DAT_aaaaaaaaaaaaaaaa;
    context.sharedPainter = (QPainter *)&DAT_aaaaaaaaaaaaaaaa;
    context.repaintManager = (QWidgetRepaintManager *)&DAT_aaaaaaaaaaaaaaaa;
    context.offset.xp.m_i = -0x55555556;
    context.offset.yp.m_i = -0x55555556;
    context._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    context.pdev._0_4_ = -0x55555556;
    context.pdev._4_4_ = -0x55555556;
    context.rgn.d._0_4_ = -0x55555556;
    context.rgn.d._4_4_ = -0x55555556;
    QWidgetPaintContext::QWidgetPaintContext
              (&context,pdev,&effectRgn,offset,flags,sharedPainter,repaintManager);
    *(QWidgetPaintContext **)&this_00[1].field_0x8 = &context;
    if (sharedPainter == (QPainter *)0x0) {
      pQVar19 = (QPaintEngine *)(**(code **)(*(long *)pdev + 0x18))(pdev);
      qVar3 = (qreal)QPaintDevice::devicePixelRatio();
      pQVar24 = (QWidgetPrivate *)&toBePainted;
      QRegion::translated(&toBePainted,(QPoint *)&effectRgn);
      setSystemClip(pQVar24,pQVar19,qVar3,&toBePainted);
      QRegion::~QRegion(&toBePainted);
      toBePainted.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter((QPainter *)&toBePainted,pdev);
      QPainter::translate((QPainter *)&toBePainted,offset);
      context.painter = (QPainter *)&toBePainted;
      (**(code **)(*(long *)this->graphicsEffect + 0x68))
                (this->graphicsEffect,(QWidgetPrivate *)&toBePainted);
      pQVar19 = (QPaintEngine *)(**(code **)(*(long *)pdev + 0x18))(pdev);
      pQVar24 = (QWidgetPrivate *)&p_1;
      QRegion::QRegion((QRegion *)&p_1);
      setSystemClip(pQVar24,pQVar19,1.0,(QRegion *)&p_1);
      QRegion::~QRegion((QRegion *)&p_1);
      QPainter::~QPainter((QPainter *)&toBePainted);
    }
    else {
      context.painter = sharedPainter;
      this_01 = (QTransform *)QPainter::worldTransform();
      cVar8 = QTransform::operator!=(this_01,(QTransform *)&this_00[1].field_0x10);
      if (cVar8 != '\0') {
        QGraphicsEffectSourcePrivate::invalidateCache(this_00,SourceChanged);
        puVar20 = (undefined1 *)QPainter::worldTransform();
        puVar23 = &this_00[1].field_0x10;
        for (lVar22 = 0x4a; lVar22 != 0; lVar22 = lVar22 + -1) {
          *puVar23 = *puVar20;
          puVar20 = puVar20 + (ulong)bVar21 * -2 + 1;
          puVar23 = puVar23 + (ulong)bVar21 * -2 + 1;
        }
      }
      QPainter::save();
      QPainter::translate(sharedPainter,offset);
      pQVar19 = (QPaintEngine *)QPainter::paintEngine();
      QPainter::device();
      qVar3 = (qreal)QPaintDevice::devicePixelRatio();
      pQVar24 = (QWidgetPrivate *)&toBePainted;
      QRegion::translated(&toBePainted,(QPoint *)&effectRgn);
      setSystemClip(pQVar24,pQVar19,qVar3,&toBePainted);
      QRegion::~QRegion(&toBePainted);
      (**(code **)(*(long *)this->graphicsEffect + 0x68))(this->graphicsEffect,sharedPainter);
      pQVar19 = (QPaintEngine *)QPainter::paintEngine();
      pQVar24 = (QWidgetPrivate *)&toBePainted;
      QRegion::QRegion(&toBePainted);
      setSystemClip(pQVar24,pQVar19,1.0,&toBePainted);
      QRegion::~QRegion(&toBePainted);
      QPainter::restore();
    }
    *(undefined8 *)&this_00[1].field_0x8 = 0;
    if (repaintManager != (QWidgetRepaintManager *)0x0) {
      QWidgetRepaintManager::markNeedsFlush
                ((QWidgetRepaintManager *)repaintManager,widget,&effectRgn,offset);
    }
    QRegion::~QRegion(&context.rgn);
    this_02 = &effectRgn;
  }
  QRegion::~QRegion(this_02);
LAB_002f2889:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::drawWidget(QPaintDevice *pdev, const QRegion &rgn, const QPoint &offset, DrawWidgetFlags flags,
                                QPainter *sharedPainter, QWidgetRepaintManager *repaintManager)
{
    if (rgn.isEmpty())
        return;

    Q_Q(QWidget);

    qCInfo(lcWidgetPainting) << "Drawing" << rgn << "of" << q << "at" << offset
        << "into paint device" << pdev << "with" << flags;

    const bool asRoot = flags & DrawAsRoot;
    bool onScreen = shouldPaintOnScreen();

#if QT_CONFIG(graphicseffect)
    if (graphicsEffect && graphicsEffect->isEnabled()) {
        QGraphicsEffectSource *source = graphicsEffect->d_func()->source;
        QWidgetEffectSourcePrivate *sourced = static_cast<QWidgetEffectSourcePrivate *>
                                                         (source->d_func());
        if (!sourced->context) {
            const QRegion effectRgn((flags & UseEffectRegionBounds) ? rgn.boundingRect() : rgn);
            QWidgetPaintContext context(pdev, effectRgn, offset, flags, sharedPainter, repaintManager);
            sourced->context = &context;
            if (!sharedPainter) {
                setSystemClip(pdev->paintEngine(), pdev->devicePixelRatio(), effectRgn.translated(offset));
                QPainter p(pdev);
                p.translate(offset);
                context.painter = &p;
                graphicsEffect->draw(&p);
                setSystemClip(pdev->paintEngine(), 1, QRegion());
            } else {
                context.painter = sharedPainter;
                if (sharedPainter->worldTransform() != sourced->lastEffectTransform) {
                    sourced->invalidateCache();
                    sourced->lastEffectTransform = sharedPainter->worldTransform();
                }
                sharedPainter->save();
                sharedPainter->translate(offset);
                setSystemClip(sharedPainter->paintEngine(), sharedPainter->device()->devicePixelRatio(), effectRgn.translated(offset));
                graphicsEffect->draw(sharedPainter);
                setSystemClip(sharedPainter->paintEngine(), 1, QRegion());
                sharedPainter->restore();
            }
            sourced->context = nullptr;

            if (repaintManager)
                repaintManager->markNeedsFlush(q, effectRgn, offset);

            return;
        }
    }
#endif // QT_CONFIG(graphicseffect)
    flags = flags & ~UseEffectRegionBounds;

    const bool alsoOnScreen = flags & DrawPaintOnScreen;
    const bool recursive = flags & DrawRecursive;
    const bool alsoInvisible = flags & DrawInvisible;

    Q_ASSERT(sharedPainter ? sharedPainter->isActive() : true);

    QRegion toBePainted(rgn);
    if (asRoot && !alsoInvisible)
        toBePainted &= clipRect(); //(rgn & visibleRegion());
    if (!(flags & DontSubtractOpaqueChildren))
        subtractOpaqueChildren(toBePainted, q->rect());

    if (!toBePainted.isEmpty()) {
        if (!onScreen || alsoOnScreen) {
            //update the "in paint event" flag
            if (Q_UNLIKELY(q->testAttribute(Qt::WA_WState_InPaintEvent)))
                qWarning("QWidget::repaint: Recursive repaint detected");
            q->setAttribute(Qt::WA_WState_InPaintEvent);

            //clip away the new area
            QPaintEngine *paintEngine = pdev->paintEngine();
            if (paintEngine) {
                setRedirected(pdev, -offset);

                if (sharedPainter)
                    setSystemClip(pdev->paintEngine(), pdev->devicePixelRatio(), toBePainted);
                else
                    paintEngine->d_func()->systemRect = q->data->crect;

                //paint the background
                if ((asRoot || q->autoFillBackground() || onScreen || q->testAttribute(Qt::WA_StyledBackground))
                    && !q->testAttribute(Qt::WA_OpaquePaintEvent) && !q->testAttribute(Qt::WA_NoSystemBackground)) {
                    beginBackingStorePainting();
                    QPainter p(q);
                    p.setRenderHint(QPainter::SmoothPixmapTransform);
                    paintBackground(&p, toBePainted, (asRoot || onScreen) ? (flags | DrawAsRoot) : DrawWidgetFlags());
                    endBackingStorePainting();
                }

                if (!sharedPainter)
                    setSystemClip(pdev->paintEngine(), pdev->devicePixelRatio(), toBePainted.translated(offset));

                if (!onScreen && !asRoot && !isOpaque && q->testAttribute(Qt::WA_TintedBackground)) {
                    beginBackingStorePainting();
                    QPainter p(q);
                    QColor tint = q->palette().window().color();
                    tint.setAlphaF(.6f);
                    p.fillRect(toBePainted.boundingRect(), tint);
                    endBackingStorePainting();
                }
            }

#if 0
            qDebug() << "painting" << q << "opaque ==" << isOpaque();
            qDebug() << "clipping to" << toBePainted << "location == " << offset
                     << "geometry ==" << QRect(q->mapTo(q->window(), QPoint(0, 0)), q->size());
#endif

            bool skipPaintEvent = false;
            if (renderToTexture) {
                // This widget renders into a texture which is composed later. We just need to
                // punch a hole in the backingstore, so the texture will be visible.
                beginBackingStorePainting();
                if (!q->testAttribute(Qt::WA_AlwaysStackOnTop) && repaintManager) {
                    QPainter p(q);
                    p.setCompositionMode(QPainter::CompositionMode_Source);
                    p.fillRect(q->rect(), Qt::transparent);
                } else if (!repaintManager) {
                    // We are not drawing to a backingstore: fall back to QImage
                    QImage img = grabFramebuffer();
                    // grabFramebuffer() always sets the format to RGB32
                    // regardless of whether it is transparent or not.
                    if (img.format() == QImage::Format_RGB32)
                        img.reinterpretAsFormat(QImage::Format_ARGB32_Premultiplied);
                    QPainter p(q);
                    p.drawImage(q->rect(), img);
                    skipPaintEvent = true;
                }
                endBackingStorePainting();
                if (renderToTextureReallyDirty)
                    renderToTextureReallyDirty = 0;
                else
                    skipPaintEvent = true;
            }

            if (!skipPaintEvent) {
                //actually send the paint event
                sendPaintEvent(toBePainted);
            }

            if (repaintManager)
                repaintManager->markNeedsFlush(q, toBePainted, offset);

            //restore
            if (paintEngine) {
                restoreRedirected();
                if (!sharedPainter)
                    paintEngine->d_func()->systemRect = QRect();
                else
                    paintEngine->d_func()->currentClipDevice = nullptr;

                setSystemClip(pdev->paintEngine(), 1, QRegion());
            }
            q->setAttribute(Qt::WA_WState_InPaintEvent, false);
            if (Q_UNLIKELY(q->paintingActive()))
                qWarning("QWidget::repaint: It is dangerous to leave painters active on a widget outside of the PaintEvent");

            if (paintEngine && paintEngine->autoDestruct()) {
                delete paintEngine;
            }
        } else if (q->isWindow()) {
            QPaintEngine *engine = pdev->paintEngine();
            if (engine) {
                QPainter p(pdev);
                p.setClipRegion(toBePainted);
                const QBrush bg = q->palette().brush(QPalette::Window);
                if (bg.style() == Qt::TexturePattern)
                    p.drawTiledPixmap(q->rect(), bg.texture());
                else
                    p.fillRect(q->rect(), bg);

                if (engine->autoDestruct())
                    delete engine;
            }
        }
    }

    if (recursive && !children.isEmpty()) {
        paintSiblingsRecursive(pdev, children, children.size() - 1, rgn, offset, flags & ~DrawAsRoot,
                               sharedPainter, repaintManager);
    }
}